

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall DMovePoly::DMovePoly(DMovePoly *this,int polyNum)

{
  TVector2<double> local_38 [2];
  int local_14;
  DMovePoly *pDStack_10;
  int polyNum_local;
  DMovePoly *this_local;
  
  local_14 = polyNum;
  pDStack_10 = this;
  DPolyAction::DPolyAction(&this->super_DPolyAction,polyNum);
  (this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00b6e1a0;
  TAngle<double>::TAngle(&this->m_Angle);
  TVector2<double>::TVector2(&this->m_Speedv);
  TAngle<double>::operator=(&this->m_Angle,0.0);
  TVector2<double>::TVector2(local_38,0.0,0.0);
  TVector2<double>::operator=(&this->m_Speedv,local_38);
  return;
}

Assistant:

DMovePoly::DMovePoly (int polyNum)
	: Super (polyNum)
{
	m_Angle = 0.;
	m_Speedv = { 0,0 };
}